

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Utility.cpp
# Opt level: O2

void __thiscall
UtilityTest_Pack16Test_Test::~UtilityTest_Pack16Test_Test(UtilityTest_Pack16Test_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UtilityTest, Pack16Test) {
    // Test case 1: Packing a single byte
    uint8_t data1[2];
    size_t offset1 = Pack16(data1, 0, 0xABCD);
    EXPECT_EQ(offset1, 2);
    EXPECT_EQ(data1[0], 0xAB);
    EXPECT_EQ(data1[1], 0xCD);

    // Test case 2: Packing a byte at a non-zero offset
    uint8_t data2[4] = {0x00, 0x00, 0x00, 0x00};
    size_t offset2 = Pack16(data2, 1, 0x3456);
    EXPECT_EQ(offset2, 3);
    EXPECT_EQ(data2[1], 0x34);
    EXPECT_EQ(data2[2], 0x56);

    // Test case 3: Packing a byte in a larger array
    uint8_t data3[6] = {0x00, 0x00, 0x00, 0x00, 0x00, 0x00};
    size_t offset3 = Pack16(data3, 3, 0x4455);
    EXPECT_EQ(offset3, 5);
    EXPECT_EQ(data3[3], 0x44);
    EXPECT_EQ(data3[4], 0x55);
}